

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacheck.hpp
# Opt level: O1

basic_ostream<char,_std::char_traits<char>_> * __thiscall
mc::detail::
error<testns::reverse_test,10u,10u,6u,mc::seed_state<5568859697023421760ul>,kvasir::mpl::list<kvasir::mpl::uint_<0ull>,char*&>>
::print<std::ostream&>
          (error<testns::reverse_test,10u,10u,6u,mc::seed_state<5568859697023421760ul>,kvasir::mpl::list<kvasir::mpl::uint_<0ull>,char*&>>
           *this,basic_ostream<char,_std::char_traits<char>_> *stream,string *suite)

{
  ostream *poVar1;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  string name;
  type_name local_61;
  string local_60;
  string local_40;
  
  func_name::operator_cast_to_string(&local_40,(func_name *)&local_60);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"[ RUN      ] ",0xd);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,(suite->_M_dataplus)._M_p,suite->_M_string_length);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_40._M_dataplus._M_p,local_40._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Failure after ",0xe);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"/",1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," tries and ",0xb);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," shrinks.",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Result: ",8);
  type_name::operator_cast_to_string(&local_60,&local_61);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_60._M_dataplus._M_p,local_60._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Parameters:",0xb);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  type_name::operator_cast_to_string(&local_60,&local_61);
  pbVar2 = (print_all(({parm#1}<<{parm#2})<<{parm#3},{parm#2},{parm#4}...))mc::print_all<std::
           ostream&,char_const(&)[3],std::__cxx11::string>(stream,(char (*) [3])"\n\t",&local_60);
  std::ios::widen((char)*(undefined8 *)(*(long *)pbVar2 + -0x18) + (char)pbVar2);
  std::ostream::put((char)pbVar2);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"[  FAILED  ] ",0xd);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,(suite->_M_dataplus)._M_p,suite->_M_string_length);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_40._M_dataplus._M_p,local_40._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," (0 ms)",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return stream;
}

Assistant:

auto &&print(Ostream &&stream, std::string &suite) const {
				std::string name{func_name<FuncName>{}};

				stream << "[ RUN      ] " << suite << name << std::endl
				       << "Failure after " << (tries - failnum) << "/" << tries << " tries and "
				       << shrinks << " shrinks." << std::endl
				       << "Result: " << std::string(type_name<FuncName<Params...>>{}) << std::endl
				       << "Parameters:";
				print_all(stream, "\n\t", std::string(type_name<Params>{})...) << std::endl;
				stream << "[  FAILED  ] " << suite << name << " (0 ms)" << std::endl;
				return stream;
			}